

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QString * __thiscall QWidget::windowTitle(QString *__return_storage_ptr__,QWidget *this)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  QFileInfo local_70 [8];
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QStringBuilder<QString,_QLatin1String> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if ((lVar1 == 0) || (lVar1 = *(long *)(lVar1 + 8), lVar1 == 0)) {
LAB_00303ca4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    lVar2 = *(long *)(lVar1 + 0x38);
    if (lVar2 == 0) {
      if (*(long *)(lVar1 + 0x80) == 0) goto LAB_00303ca4;
      QFileInfo::QFileInfo(local_70,(QString *)(lVar1 + 0x70));
      QFileInfo::fileName();
      local_48.a.d.size = local_58;
      local_48.a.d.ptr = pcStack_60;
      local_48.a.d.d = (Data *)local_68;
      local_68 = (QArrayData *)0x0;
      pcStack_60 = (char16_t *)0x0;
      local_58 = 0;
      local_48.b.m_size = 3;
      local_48.b.m_data = "[*]";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(__return_storage_ptr__,&local_48);
      if (&(local_48.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
      QFileInfo::~QFileInfo(local_70);
    }
    else {
      pDVar3 = *(Data **)(lVar1 + 0x28);
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar1 + 0x30);
      (__return_storage_ptr__->d).size = lVar2;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QWidget::windowTitle() const
{
    Q_D(const QWidget);
    if (d->extra && d->extra->topextra) {
        if (!d->extra->topextra->caption.isEmpty())
            return d->extra->topextra->caption;
        if (!d->extra->topextra->filePath.isEmpty())
            return QFileInfo(d->extra->topextra->filePath).fileName() + "[*]"_L1;
    }
    return QString();
}